

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O1

void __thiscall hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,UnaryExpression *expr)

{
  undefined1 *puVar1;
  Expression *this_00;
  SourceLocation SVar2;
  runtime_error *this_01;
  long lVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_58;
  char *local_38;
  size_t local_30;
  
  this_00 = expr->operand_;
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"(",1);
  switch(expr->op) {
  case Plus:
    pcVar4 = "+";
    break;
  case Minus:
    pcVar4 = "-";
    break;
  case BitwiseNot:
    pcVar4 = "~";
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x20);
    pcVar4 = *(char **)(slang::ast::toString(slang::ast::UnaryOperator)::strings +
                       (long)(int)expr->op * 8);
    local_30 = strlen(pcVar4);
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x25;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_38;
    local_38 = pcVar4;
    ::fmt::v9::vformat_abi_cxx11_(&sStack_58,(v9 *)"Unary type {0} not supported for hgdb",fmt,args)
    ;
    SVar2 = *this->loc_;
    std::runtime_error::runtime_error(this_01,(string *)&sStack_58);
    *(undefined ***)this_01 = &PTR__runtime_error_004e9040;
    *(SourceLocation *)(this_01 + 0x10) = SVar2;
    this_01[0x18] = (runtime_error)0x1;
    __cxa_throw(this_01,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
  case LogicalNot:
    pcVar4 = "!";
    break;
  case Preincrement:
    pcVar4 = "++";
    goto LAB_0014ae32;
  case Predecrement:
    pcVar4 = "--";
LAB_0014ae32:
    lVar3 = 2;
    goto LAB_0014ae6e;
  case Postincrement:
    slang::ast::Expression::
    visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
              (this_00,this_00,this);
    pcVar4 = "++";
    goto LAB_0014aea5;
  case Postdecrement:
    slang::ast::Expression::
    visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
              (this_00,this_00,this);
    pcVar4 = "--";
LAB_0014aea5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar4,2);
    return;
  }
  lVar3 = 1;
LAB_0014ae6e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar4,lVar3);
  slang::ast::Expression::
  visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>(this_00,this_00,this);
  return;
}

Assistant:

void handle(const slang::ast::UnaryExpression &expr) {
        auto const &op = expr.operand();
        ss_ << "(";
        // simple ones that have C++ operator overloaded
        switch (expr.op) {
            case slang::ast::UnaryOperator::Minus:
                ss_ << "-";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Plus:
                ss_ << "+";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Predecrement:
                ss_ << "--";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Preincrement:
                ss_ << "++";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::LogicalNot:
                ss_ << "!";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::BitwiseNot:
                ss_ << "~";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Postdecrement:
                op.visit(*this);
                ss_ << "--";
                break;
            case slang::ast::UnaryOperator::Postincrement:
                op.visit(*this);
                ss_ << "++";
                break;
            default:
                throw NotSupportedException(fmt::format("Unary type {0} not supported for hgdb",
                                                        slang::ast::toString(expr.op)),
                                            loc_);
        }
    }